

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O0

ostream * std::operator<<(ostream *os,
                         vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
                         *v)

{
  bool bVar1;
  ostream *poVar2;
  Word *word;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  *in_RSI;
  ostream *in_RDI;
  size_t i;
  Word *in_stack_ffffffffffffffc8;
  ostream *in_stack_ffffffffffffffd0;
  vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
  *in_stack_ffffffffffffffe0;
  ostream *os_00;
  ostream *__n;
  ostream *local_8;
  
  bVar1 = vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
          ::empty(in_stack_ffffffffffffffe0);
  if (bVar1) {
    local_8 = std::operator<<(in_RDI,"[]");
  }
  else {
    std::operator<<(in_RDI,"[");
    vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
    operator[](in_RSI,0);
    cppjieba::operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    os_00 = (ostream *)0x1;
    while( true ) {
      __n = os_00;
      poVar2 = (ostream *)
               vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>
               ::size(in_RSI);
      if (poVar2 <= os_00) break;
      word = (Word *)std::operator<<(in_RDI,", ");
      vector<cppjieba::KeywordExtractor::Word,_std::allocator<cppjieba::KeywordExtractor::Word>_>::
      operator[](in_RSI,(size_type)__n);
      cppjieba::operator<<(os_00,word);
      os_00 = __n + 1;
    }
    std::operator<<(in_RDI,"]");
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}